

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v5::
format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_format_specs(format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  size_t *psVar1;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *pbVar2;
  char *pcVar3;
  char *pcVar4;
  type tVar5;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  handler;
  format_specs local_88;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  local_68;
  custom_arg_formatter local_50;
  
  local_68.
  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .super_specs_setter<char>.specs_ = &local_88;
  pcVar4 = (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .parse_context_.format_str_.data_;
  (this->context).
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  .parse_context_.format_str_.data_ = begin;
  psVar1 = &(this->context).
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            .parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar4 + (*psVar1 - (long)begin));
  pbVar2 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)
              ((void *)(this->arg).value_.field_0.long_long_value,pbVar2);
    pcVar4 = (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
             .parse_context_.format_str_.data_;
  }
  else {
    local_88.super_align_spec.width_ = 0;
    local_88.super_align_spec.fill_ = L' ';
    local_88.super_align_spec.align_ = ALIGN_DEFAULT;
    local_88.super_core_format_specs.precision = -1;
    local_88.super_core_format_specs.flags = '\0';
    local_88.super_core_format_specs.type = '\0';
    local_68.arg_type_ = (this->arg).type_;
    local_68.
    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .context_ = pbVar2;
    pcVar4 = internal::
             parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                       (begin,end,&local_68);
    if ((pcVar4 == end) || (*pcVar4 != '}')) {
      internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
    }
    pcVar3 = (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
             .parse_context_.format_str_.data_;
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .parse_context_.format_str_.data_ = pcVar4;
    psVar1 = &(this->context).
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
              .parse_context_.format_str_.size_;
    *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)pcVar4));
    local_50.
    super_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.out_.container =
         (this->context).
         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         .out_.container;
    local_50.
    super_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.locale_.locale_ =
         (this->context).
         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         .loc_.locale_;
    local_50.
    super_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    specs_ = &local_88;
    local_50.
    super_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.ctx_ =
         pbVar2;
    tVar5 = visit_format_arg<custom_arg_formatter,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      (&local_50,&this->arg);
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .out_.container = tVar5.container;
  }
  return pcVar4;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }